

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.h
# Opt level: O0

bool __thiscall
clipp::group::child_t<clipp::parameter,_clipp::group>::required
          (child_t<clipp::parameter,_clipp::group> *this)

{
  bool bVar1;
  bool local_2b;
  child_t<clipp::parameter,_clipp::group> *this_local;
  
  if (this->type_ == param) {
    bVar1 = parameter::required((parameter *)this);
    return bVar1;
  }
  if (this->type_ == group) {
    bVar1 = exclusive((group *)this);
    if ((bVar1) && (bVar1 = all_required((group *)this), bVar1)) {
      return true;
    }
    bVar1 = exclusive((group *)this);
    local_2b = false;
    if (!bVar1) {
      local_2b = any_required((group *)this);
    }
    return local_2b;
  }
  return false;
}

Assistant:

bool required() const noexcept {
            switch(type_) {
                case type::param: return m_.param.required();
                case type::group:
                    return (m_.group.exclusive() && m_.group.all_required() ) ||
                          (!m_.group.exclusive() && m_.group.any_required()  );
                default: return false;
            }
        }